

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttcolr.c
# Opt level: O3

FT_Bool tt_face_get_color_glyph_clipbox(TT_Face face,FT_UInt base_glyph,FT_ClipBox *clip_box)

{
  Colr *colr;
  FT_Byte *pFVar1;
  void *pvVar2;
  ulong uVar3;
  FT_Size pFVar4;
  uint uVar5;
  byte *pbVar6;
  long lVar7;
  FT_Pos FVar8;
  FT_Face_Internal matrix;
  ulong uVar9;
  long lVar10;
  FT_Pos FVar11;
  long lVar12;
  FT_Pos FVar13;
  FT_Pos FVar14;
  FT_Vector corners [4];
  FT_Vector local_78;
  FT_Pos local_68;
  FT_Pos FStack_60;
  FT_Pos local_58;
  FT_Pos FStack_50;
  FT_Pos local_48;
  FT_Pos FStack_40;
  
  colr = (Colr *)face->colr;
  if (colr == (Colr *)0x0) {
    return '\0';
  }
  pFVar1 = colr->clip_list;
  if (pFVar1 != (FT_Byte *)0x0) {
    pvVar2 = colr->table;
    uVar3 = colr->table_size;
    if ((pFVar1 <= (FT_Byte *)((long)pvVar2 + (uVar3 - 5))) && (*pFVar1 == '\x01')) {
      uVar5 = *(uint *)(pFVar1 + 1);
      uVar9 = (ulong)(uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 |
                     uVar5 << 0x18);
      if (uVar3 / 7 <= uVar9 - 1) {
        return '\0';
      }
      if ((FT_Byte *)((long)pvVar2 + uVar9 * -7 + uVar3) < pFVar1 + 5) {
        return '\0';
      }
      pbVar6 = pFVar1 + 0xb;
      do {
        if (((ushort)(*(ushort *)(pbVar6 + -6) << 8 | *(ushort *)(pbVar6 + -6) >> 8) <= base_glyph)
           && (base_glyph <= (ushort)(*(ushort *)(pbVar6 + -4) << 8 | *(ushort *)(pbVar6 + -4) >> 8)
              )) {
          pbVar6 = pFVar1 + ((ulong)*pbVar6 |
                            (ulong)((uint)pbVar6[-1] << 8 | (uint)pbVar6[-2] << 0x10));
          if ((byte *)((long)pvVar2 + (uVar3 - 1)) < pbVar6) {
            return '\0';
          }
          if (pbVar6 + 1 <= (byte *)((long)pvVar2 + (uVar3 - 8)) && *pbVar6 < 3) {
            pFVar4 = (face->root).size;
            lVar7 = (long)(int)(pFVar4->metrics).x_scale;
            lVar10 = ((long)(short)((ushort)pbVar6[1] << 8) | (ulong)pbVar6[2]) * lVar7;
            FVar11 = lVar10 + 0x8000 + (lVar10 >> 0x3f) >> 0x10;
            lVar10 = (long)(int)(pFVar4->metrics).y_scale;
            lVar12 = ((long)(short)((ushort)pbVar6[3] << 8) | (ulong)pbVar6[4]) * lVar10;
            FVar13 = lVar12 + 0x8000 + (lVar12 >> 0x3f) >> 0x10;
            lVar7 = ((long)(short)((ushort)pbVar6[5] << 8) | (ulong)pbVar6[6]) * lVar7;
            FVar8 = lVar7 + 0x8000 + (lVar7 >> 0x3f) >> 0x10;
            lVar10 = ((long)(short)((ushort)pbVar6[7] << 8) | (ulong)pbVar6[8]) * lVar10;
            FVar14 = lVar10 + 0x8000 + (lVar10 >> 0x3f) >> 0x10;
            if (*pbVar6 == 2) {
              local_78.x = 0;
              local_78.y = 0;
              if ((byte *)((long)pvVar2 + (uVar3 - 4)) < pbVar6 + 9) {
                return '\0';
              }
              uVar5 = *(uint *)(pbVar6 + 9);
              get_deltas_for_var_index_base
                        (face,colr,
                         (ulong)(uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 |
                                uVar5 << 0x18),4,(FT_ItemVarDelta *)&local_78);
              pFVar4 = (face->root).size;
              lVar7 = (long)(int)(pFVar4->metrics).x_scale;
              lVar10 = (int)local_78.x * lVar7;
              FVar11 = FVar11 + (int)((ulong)(lVar10 + 0x8000 + (lVar10 >> 0x3f)) >> 0x10);
              lVar10 = (long)(int)(pFVar4->metrics).y_scale;
              lVar12 = local_78.x._4_4_ * lVar10;
              FVar13 = FVar13 + (int)((ulong)(lVar12 + 0x8000 + (lVar12 >> 0x3f)) >> 0x10);
              lVar7 = (int)local_78.y * lVar7;
              FVar8 = FVar8 + (int)((ulong)(lVar7 + 0x8000 + (lVar7 >> 0x3f)) >> 0x10);
              lVar10 = local_78.y._4_4_ * lVar10;
              FVar14 = FVar14 + (int)((ulong)(lVar10 + 0x8000 + (lVar10 >> 0x3f)) >> 0x10);
            }
            local_68 = FVar11;
            local_58 = FVar8;
            local_48 = FVar8;
            local_78.y = FVar13;
            local_78.x = FVar11;
            FStack_60 = FVar14;
            FStack_50 = FVar14;
            FStack_40 = FVar13;
            matrix = (face->root).internal;
            uVar5 = matrix->transform_flags;
            lVar7 = 0;
            do {
              if ((uVar5 & 1) != 0) {
                FT_Vector_Transform((FT_Vector *)((long)&local_78.x + lVar7),
                                    &matrix->transform_matrix);
                matrix = (face->root).internal;
                uVar5 = matrix->transform_flags;
              }
              if ((uVar5 & 2) != 0) {
                lVar10 = (matrix->transform_delta).y;
                *(FT_Pos *)((long)&local_78.x + lVar7) =
                     (matrix->transform_delta).x + *(long *)((long)&local_78.x + lVar7);
                *(long *)((long)&local_78.y + lVar7) = lVar10 + *(long *)((long)&local_78.y + lVar7)
                ;
              }
              lVar7 = lVar7 + 0x10;
            } while (lVar7 != 0x40);
            (clip_box->bottom_left).x = local_78.x;
            (clip_box->bottom_left).y = local_78.y;
            (clip_box->top_left).x = local_68;
            (clip_box->top_left).y = FStack_60;
            (clip_box->top_right).x = local_58;
            (clip_box->top_right).y = FStack_50;
            (clip_box->bottom_right).x = local_48;
            (clip_box->bottom_right).y = FStack_40;
            return '\x01';
          }
          return '\0';
        }
        pbVar6 = pbVar6 + 7;
        uVar9 = uVar9 - 1;
      } while (uVar9 != 0);
    }
  }
  return '\0';
}

Assistant:

FT_LOCAL_DEF( FT_Bool )
  tt_face_get_color_glyph_clipbox( TT_Face      face,
                                   FT_UInt      base_glyph,
                                   FT_ClipBox*  clip_box )
  {
    Colr*  colr;

    FT_Byte  *p, *p1, *clip_base, *limit;

    FT_Byte    clip_list_format;
    FT_ULong   num_clip_boxes, i;
    FT_UShort  gid_start, gid_end;
    FT_UInt32  clip_box_offset;
    FT_Byte    format;

    const FT_Byte  num_corners = 4;
    FT_Vector      corners[4];
    FT_Byte        j;
    FT_BBox        font_clip_box;


    colr = (Colr*)face->colr;
    if ( !colr )
      return 0;

    if ( !colr->clip_list )
      return 0;

    p = colr->clip_list;

    /* Limit points to the first byte after the end of the color table.    */
    /* Thus, in subsequent limit checks below we need to check whether the */
    /* read pointer is strictly greater than a position offset by certain  */
    /* field sizes to the left of that position.                           */
    limit = (FT_Byte*)colr->table + colr->table_size;

    /* Check whether we can extract one `uint8` and one `uint32`. */
    if ( p > limit - ( 1 + 4 ) )
      return 0;

    clip_base        = p;
    clip_list_format = FT_NEXT_BYTE ( p );

    /* Format byte used here to be able to upgrade ClipList for >16bit */
    /* glyph ids; for now we can expect it to be 1.                    */
    if ( !( clip_list_format == 1 ) )
      return 0;

    num_clip_boxes = FT_NEXT_ULONG( p );

    /* Check whether we can extract two `uint16` and one `Offset24`, */
    /* `num_clip_boxes` times.                                       */
    if ( colr->table_size / ( 2 + 2 + 3 ) < num_clip_boxes ||
         p > limit - ( 2 + 2 + 3 ) * num_clip_boxes        )
      return 0;

    for ( i = 0; i < num_clip_boxes; ++i )
    {
      gid_start       = FT_NEXT_USHORT( p );
      gid_end         = FT_NEXT_USHORT( p );
      clip_box_offset = FT_NEXT_UOFF3( p );

      if ( base_glyph >= gid_start && base_glyph <= gid_end )
      {
        p1 = (FT_Byte*)( clip_base + clip_box_offset );

        /* Check whether we can extract one `uint8`. */
        if ( p1 > limit - 1 )
          return 0;

        format = FT_NEXT_BYTE( p1 );

        if ( format > 2 )
          return 0;

        /* Check whether we can extract four `FWORD`. */
        if ( p1 > limit - ( 2 + 2 + 2 + 2 ) )
          return 0;

        /* `face->root.size->metrics.x_scale` and `y_scale` are factors   */
        /* that scale a font unit value in integers to a 26.6 fixed value */
        /* according to the requested size, see for example               */
        /* `ft_recompute_scaled_metrics`.                                 */
        font_clip_box.xMin = FT_MulFix( FT_NEXT_SHORT( p1 ),
                                        face->root.size->metrics.x_scale );
        font_clip_box.yMin = FT_MulFix( FT_NEXT_SHORT( p1 ),
                                        face->root.size->metrics.y_scale );
        font_clip_box.xMax = FT_MulFix( FT_NEXT_SHORT( p1 ),
                                        face->root.size->metrics.x_scale );
        font_clip_box.yMax = FT_MulFix( FT_NEXT_SHORT( p1 ),
                                        face->root.size->metrics.y_scale );

#ifdef TT_CONFIG_OPTION_GX_VAR_SUPPORT
        if ( format == 2 )
        {
          FT_ULong         var_index_base = 0;
          /* varIndexBase offset for clipbox is 3 at most. */
          FT_ItemVarDelta  item_deltas[4] = { 0, 0, 0, 0 };


          /* Check whether we can extract a 32-bit varIndexBase now. */
          if ( p1 > limit - 4 )
            return 0;

          var_index_base = FT_NEXT_ULONG( p1 );

          if ( !get_deltas_for_var_index_base( face, colr, var_index_base, 4,
                                               item_deltas ) )
            return 0;

          font_clip_box.xMin +=
            FT_MulFix( item_deltas[0], face->root.size->metrics.x_scale );
          font_clip_box.yMin +=
            FT_MulFix( item_deltas[1], face->root.size->metrics.y_scale );
          font_clip_box.xMax +=
            FT_MulFix( item_deltas[2], face->root.size->metrics.x_scale );
          font_clip_box.yMax +=
            FT_MulFix( item_deltas[3], face->root.size->metrics.y_scale );
        }
#endif

        /* Make 4 corner points (xMin, yMin), (xMax, yMax) and transform */
        /* them.  If we we would only transform two corner points and    */
        /* span a rectangle based on those, the rectangle may become too */
        /* small to cover the glyph.                                     */
        corners[0].x = font_clip_box.xMin;
        corners[1].x = font_clip_box.xMin;
        corners[2].x = font_clip_box.xMax;
        corners[3].x = font_clip_box.xMax;

        corners[0].y = font_clip_box.yMin;
        corners[1].y = font_clip_box.yMax;
        corners[2].y = font_clip_box.yMax;
        corners[3].y = font_clip_box.yMin;

        for ( j = 0; j < num_corners; ++j )
        {
          if ( face->root.internal->transform_flags & 1 )
            FT_Vector_Transform( &corners[j],
                                 &face->root.internal->transform_matrix );

          if ( face->root.internal->transform_flags & 2 )
          {
            corners[j].x += face->root.internal->transform_delta.x;
            corners[j].y += face->root.internal->transform_delta.y;
          }
        }

        clip_box->bottom_left  = corners[0];
        clip_box->top_left     = corners[1];
        clip_box->top_right    = corners[2];
        clip_box->bottom_right = corners[3];

        return 1;
      }
    }

    return 0;
  }